

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_context.cpp
# Opt level: O2

unique_ptr<duckdb::TableDescription,_std::default_delete<duckdb::TableDescription>,_true> __thiscall
duckdb::ClientContext::TableInfo
          (ClientContext *this,string *database_name,string *schema_name,string *table_name)

{
  undefined8 in_R8;
  _Any_data local_48;
  code *local_38;
  code *pcStack_30;
  
  (this->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
  super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  local_38 = (code *)0x0;
  pcStack_30 = (code *)0x0;
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  local_48._M_unused._M_object = operator_new(0x28);
  *(string **)local_48._M_unused._0_8_ = database_name;
  *(string **)((long)local_48._M_unused._0_8_ + 8) = schema_name;
  *(string **)((long)local_48._M_unused._0_8_ + 0x10) = table_name;
  *(undefined8 *)((long)local_48._M_unused._0_8_ + 0x18) = in_R8;
  *(ClientContext **)((long)local_48._M_unused._0_8_ + 0x20) = this;
  pcStack_30 = ::std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/main/client_context.cpp:1176:27)>
               ::_M_invoke;
  local_38 = ::std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/main/client_context.cpp:1176:27)>
             ::_M_manager;
  RunFunctionInTransaction((ClientContext *)database_name,(function<void_()> *)&local_48,true);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_48);
  return (unique_ptr<duckdb::TableDescription,_std::default_delete<duckdb::TableDescription>_>)
         (unique_ptr<duckdb::TableDescription,_std::default_delete<duckdb::TableDescription>_>)this;
}

Assistant:

unique_ptr<TableDescription> ClientContext::TableInfo(const string &database_name, const string &schema_name,
                                                      const string &table_name) {
	unique_ptr<TableDescription> result;
	RunFunctionInTransaction([&]() {
		// Obtain the table from the catalog.
		auto table = Catalog::GetEntry<TableCatalogEntry>(*this, database_name, schema_name, table_name,
		                                                  OnEntryNotFound::RETURN_NULL);
		if (!table) {
			return;
		}
		// Create the table description.
		result = make_uniq<TableDescription>(database_name, schema_name, table_name);
		auto &catalog = Catalog::GetCatalog(*this, database_name);
		result->readonly = catalog.GetAttached().IsReadOnly();
		for (auto &column : table->GetColumns().Logical()) {
			result->columns.emplace_back(column.Copy());
		}
	});
	return result;
}